

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_TargetTypeEnforcementMultipleTargetsInvalid_Test::
CommandLineInterfaceTest_TargetTypeEnforcementMultipleTargetsInvalid_Test
          (CommandLineInterfaceTest_TargetTypeEnforcementMultipleTargetsInvalid_Test *this)

{
  CommandLineInterfaceTest_TargetTypeEnforcementMultipleTargetsInvalid_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)
       &PTR__CommandLineInterfaceTest_TargetTypeEnforcementMultipleTargetsInvalid_Test_029fe218;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, TargetTypeEnforcementMultipleTargetsInvalid) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
      syntax = "proto2";
      package proto2_unittest;
      import "google/protobuf/descriptor.proto";
      message MyOptions {
        optional string message_or_file_option = 1 [
            targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_FILE];
      }
      extend google.protobuf.EnumOptions {
        optional MyOptions enum_options = 5000;
      }
      enum MyEnum {
        MY_ENUM_UNSPECIFIED = 0;
        option (enum_options).message_or_file_option = "y";
      }
      )schema");

  Run("protocol_compiler --plug_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Option proto2_unittest.MyOptions.message_or_file_option cannot be set "
      "on an entity of type `enum`.");
}